

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

void exchange_int16s(void *a,void *b,size_t size)

{
  uint16_t uVar1;
  uint16_t t;
  uint16_t *bp;
  uint16_t *ap;
  size_t size_local;
  void *b_local;
  void *a_local;
  
  bp = (uint16_t *)b;
  ap = (uint16_t *)a;
  size_local = size >> 1;
  while (size_local != 0) {
    uVar1 = *ap;
    *ap = *bp;
    *bp = uVar1;
    bp = bp + 1;
    ap = ap + 1;
    size_local = size_local - 1;
  }
  return;
}

Assistant:

static void exchange_int16s(void *a, void *b, size_t size) {
    uint16_t *ap = (uint16_t *)a;
    uint16_t *bp = (uint16_t *)b;

    for (size /= sizeof(uint16_t); size-- != 0;) {
        uint16_t t = *ap;
        *ap++ = *bp;
        *bp++ = t;
    }
}